

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_avx2.c
# Opt level: O3

void aom_quantize_b_32x32_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  
  auVar16 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])zbin_ptr),0x54);
  auVar4 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
  auVar16 = vpsubw_avx2(auVar16,auVar4);
  auVar10 = vpsraw_avx2(auVar16,1);
  auVar16 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])round_ptr),0x54);
  auVar16 = vpsubw_avx2(auVar16,auVar4);
  auVar11 = vpsraw_avx2(auVar16,1);
  auVar1 = *(undefined1 (*) [16])quant_ptr;
  auVar2 = *(undefined1 (*) [16])dequant_ptr;
  auVar3 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar9 = vpackssdw_avx2(*(undefined1 (*) [32])coeff_ptr,*(undefined1 (*) [32])(coeff_ptr + 8));
  auVar16 = vpabsw_avx2(auVar9);
  auVar15 = vpcmpgtw_avx2(auVar10,auVar16);
  if (((uint)(SUB321(auVar15 >> 7,0) & 1) | (uint)(SUB321(auVar15 >> 0xf,0) & 1) << 1 |
       (uint)(SUB321(auVar15 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar15 >> 0x1f,0) & 1) << 3 |
       (uint)(SUB321(auVar15 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar15 >> 0x2f,0) & 1) << 5 |
       (uint)(SUB321(auVar15 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar15 >> 0x3f,0) & 1) << 7 |
       (uint)(SUB321(auVar15 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar15 >> 0x4f,0) & 1) << 9 |
       (uint)(SUB321(auVar15 >> 0x57,0) & 1) << 10 | (uint)(SUB321(auVar15 >> 0x5f,0) & 1) << 0xb |
       (uint)(SUB321(auVar15 >> 0x67,0) & 1) << 0xc | (uint)(SUB321(auVar15 >> 0x6f,0) & 1) << 0xd |
       (uint)(SUB321(auVar15 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar15 >> 0x7f,0) << 0xf |
       (uint)(SUB321(auVar15 >> 0x87,0) & 1) << 0x10 | (uint)(SUB321(auVar15 >> 0x8f,0) & 1) << 0x11
       | (uint)(SUB321(auVar15 >> 0x97,0) & 1) << 0x12 |
       (uint)(SUB321(auVar15 >> 0x9f,0) & 1) << 0x13 | (uint)(SUB321(auVar15 >> 0xa7,0) & 1) << 0x14
       | (uint)(SUB321(auVar15 >> 0xaf,0) & 1) << 0x15 |
       (uint)(SUB321(auVar15 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar15 >> 0xbf,0) << 0x17 |
       (uint)(SUB321(auVar15 >> 199,0) & 1) << 0x18 | (uint)(SUB321(auVar15 >> 0xcf,0) & 1) << 0x19
       | (uint)(SUB321(auVar15 >> 0xd7,0) & 1) << 0x1a |
       (uint)(SUB321(auVar15 >> 0xdf,0) & 1) << 0x1b | (uint)(SUB321(auVar15 >> 0xe7,0) & 1) << 0x1c
       | (uint)(SUB321(auVar15 >> 0xef,0) & 1) << 0x1d |
       (uint)(SUB321(auVar15 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar15[0x1f] >> 7) << 0x1f) ==
      0xffffffff) {
    auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    *(undefined1 (*) [32])qcoeff_ptr = auVar9;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar9;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar9;
    auVar16 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  }
  else {
    auVar16 = vpaddsw_avx2(auVar16,auVar11);
    auVar16 = vpandn_avx2(auVar15,auVar16);
    auVar15 = vpermq_avx2(ZEXT1632(auVar1),0x54);
    auVar15 = vpmulhw_avx2(auVar15,auVar16);
    auVar16 = vpaddw_avx2(auVar15,auVar16);
    auVar7 = vpermq_avx2(ZEXT1632(auVar3),0x54);
    auVar15 = vpmulhw_avx2(auVar7,auVar16);
    auVar16 = vpmullw_avx2(auVar7,auVar16);
    auVar7 = vpsrlw_avx2(auVar16,0xf);
    auVar16 = vpaddw_avx2(auVar15,auVar15);
    auVar7 = vpor_avx2(auVar16,auVar7);
    auVar15 = vpermq_avx2(ZEXT1632(auVar2),0x54);
    auVar16 = vpmulhw_avx2(auVar15,auVar7);
    auVar15 = vpmullw_avx2(auVar15,auVar7);
    auVar15 = vpsrlw_avx2(auVar15,1);
    auVar16 = vpsllw_avx2(auVar16,0xf);
    auVar16 = vpor_avx2(auVar16,auVar15);
    auVar15 = vpsignw_avx2(auVar16,auVar9);
    auVar9 = vpsignw_avx2(auVar7,auVar9);
    auVar16 = vpcmpgtw_avx2(auVar7,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar8 = vpsraw_avx2(auVar9,0xf);
    auVar7 = vpunpcklwd_avx2(auVar9,auVar8);
    auVar9 = vpunpckhwd_avx2(auVar9,auVar8);
    *(undefined1 (*) [32])qcoeff_ptr = auVar7;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar9;
    auVar9 = vpsraw_avx2(auVar15,0xf);
    auVar7 = vpunpcklwd_avx2(auVar15,auVar9);
    auVar9 = vpunpckhwd_avx2(auVar15,auVar9);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar7;
  }
  *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar9;
  auVar9 = vpermq_avx2(*(undefined1 (*) [32])iscan,0xd8);
  auVar9 = vpsubw_avx2(auVar9,auVar16);
  auVar16 = vpand_avx2(auVar9,auVar16);
  auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar16 = vpmaxsw_avx2(auVar16,auVar9);
  if (0x10 < n_coeffs) {
    auVar4 = vpaddw_avx2(auVar10,auVar4);
    auVar4 = vpshufd_avx2(auVar4,0xee);
    auVar15 = vpshufd_avx2(auVar11,0xee);
    auVar10 = vpermq_avx2(ZEXT1632(auVar1),0x55);
    auVar11 = vpermq_avx2(ZEXT1632(auVar3),0x55);
    auVar7 = vpermq_avx2(ZEXT1632(auVar2),0x55);
    uVar6 = n_coeffs + 0x10;
    lVar5 = 0;
    do {
      auVar14 = vpackssdw_avx2(*(undefined1 (*) [32])((long)coeff_ptr + lVar5 * 2 + 0x40),
                               *(undefined1 (*) [32])((long)coeff_ptr + lVar5 * 2 + 0x60));
      auVar8 = vpabsw_avx2(auVar14);
      auVar17 = vpcmpgtw_avx2(auVar8,auVar4);
      if ((((((((((((((((((((((((((((((((auVar17 >> 7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar17 >> 0xf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar17 >> 0x17 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar17 >> 0x1f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar17 >> 0x27 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar17 >> 0x2f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar17 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar17 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar17 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar17 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar17 >> 0x57 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar17 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar17 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar17 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar17 >> 0x7f,0) == '\0') &&
                        (auVar17 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar17 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar17 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar17 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar17 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar17 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar17 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar17 >> 0xbf,0) == '\0') &&
                (auVar17 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar17 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar17 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar17 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar17 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar17 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar17 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar17[0x1f])
      {
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar5 * 2 + 0x40) = auVar9;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar5 * 2 + 0x40) = auVar9;
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar5 * 2 + 0x60) = auVar9;
        auVar14 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar8 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      }
      else {
        auVar8 = vpaddsw_avx2(auVar8,auVar15);
        auVar8 = vpand_avx2(auVar17,auVar8);
        auVar17 = vpmulhw_avx2(auVar8,auVar10);
        auVar8 = vpaddw_avx2(auVar17,auVar8);
        auVar17 = vpmulhw_avx2(auVar8,auVar11);
        auVar8 = vpmullw_avx2(auVar8,auVar11);
        auVar12 = vpsrlw_avx2(auVar8,0xf);
        auVar8 = vpaddw_avx2(auVar17,auVar17);
        auVar12 = vpor_avx2(auVar8,auVar12);
        auVar8 = vpmulhw_avx2(auVar12,auVar7);
        auVar17 = vpmullw_avx2(auVar12,auVar7);
        auVar17 = vpsrlw_avx2(auVar17,1);
        auVar8 = vpsllw_avx2(auVar8,0xf);
        auVar8 = vpor_avx2(auVar8,auVar17);
        auVar17 = vpsignw_avx2(auVar8,auVar14);
        auVar14 = vpsignw_avx2(auVar12,auVar14);
        auVar8 = vpcmpgtw_avx2(auVar12,auVar9);
        auVar13 = vpsraw_avx2(auVar14,0xf);
        auVar12 = vpunpcklwd_avx2(auVar14,auVar13);
        auVar14 = vpunpckhwd_avx2(auVar14,auVar13);
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar5 * 2 + 0x40) = auVar12;
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar5 * 2 + 0x60) = auVar14;
        auVar14 = vpsraw_avx2(auVar17,0xf);
        auVar12 = vpunpcklwd_avx2(auVar17,auVar14);
        auVar14 = vpunpckhwd_avx2(auVar17,auVar14);
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar5 * 2 + 0x40) = auVar12;
      }
      *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar5 * 2 + 0x60) = auVar14;
      auVar14 = vpermq_avx2(*(undefined1 (*) [32])((long)iscan + lVar5 + 0x20),0xd8);
      auVar14 = vpsubw_avx2(auVar14,auVar8);
      auVar8 = vpand_avx2(auVar14,auVar8);
      auVar16 = vpmaxsw_avx2(auVar16,auVar8);
      uVar6 = uVar6 - 0x10;
      lVar5 = lVar5 + 0x20;
    } while (0x20 < uVar6);
  }
  auVar1 = vpmaxsw_avx(auVar16._0_16_,auVar16._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xe);
  auVar1 = vpmaxsw_avx(auVar1,auVar2);
  auVar2 = vpshuflw_avx(auVar1,0xe);
  auVar1 = vpmaxsw_avx(auVar1,auVar2);
  auVar2 = vpshuflw_avx(auVar1,1);
  auVar1 = vpmaxsw_avx(auVar1,auVar2);
  vpextrw_avx(auVar1,1);
  return;
}

Assistant:

void aom_quantize_b_32x32_avx2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                               const int16_t *zbin_ptr,
                               const int16_t *round_ptr,
                               const int16_t *quant_ptr,
                               const int16_t *quant_shift_ptr,
                               tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                               const int16_t *dequant_ptr, uint16_t *eob_ptr,
                               const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  quantize_b_no_qmatrix_avx2(coeff_ptr, n_coeffs, zbin_ptr, round_ptr,
                             quant_ptr, quant_shift_ptr, qcoeff_ptr,
                             dqcoeff_ptr, dequant_ptr, eob_ptr, iscan, 1);
}